

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

void pospopcnt_u8_avx2_horizreduce(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  ulong uVar4;
  int j;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  
  if ((len & 0xffffffffffffff80) == 0) {
    auVar30 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar10 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar31 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar8 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar7 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar29 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar28 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    pauVar3 = (undefined1 (*) [32])data;
  }
  else {
    auVar22._8_4_ = 0x55555555;
    auVar22._0_8_ = 0x5555555555555555;
    auVar22._12_4_ = 0x55555555;
    auVar22._16_4_ = 0x55555555;
    auVar22._20_4_ = 0x55555555;
    auVar22._24_4_ = 0x55555555;
    auVar22._28_4_ = 0x55555555;
    auVar24._8_4_ = 0x33333333;
    auVar24._0_8_ = 0x3333333333333333;
    auVar24._12_4_ = 0x33333333;
    auVar24._16_4_ = 0x33333333;
    auVar24._20_4_ = 0x33333333;
    auVar24._24_4_ = 0x33333333;
    auVar24._28_4_ = 0x33333333;
    auVar26[8] = 7;
    auVar26._0_8_ = 0x707070707070707;
    auVar26[9] = 7;
    auVar26[10] = 7;
    auVar26[0xb] = 7;
    auVar26[0xc] = 7;
    auVar26[0xd] = 7;
    auVar26[0xe] = 7;
    auVar26[0xf] = 7;
    auVar26[0x10] = 7;
    auVar26[0x11] = 7;
    auVar26[0x12] = 7;
    auVar26[0x13] = 7;
    auVar26[0x14] = 7;
    auVar26[0x15] = 7;
    auVar26[0x16] = 7;
    auVar26[0x17] = 7;
    auVar26[0x18] = 7;
    auVar26[0x19] = 7;
    auVar26[0x1a] = 7;
    auVar26[0x1b] = 7;
    auVar26[0x1c] = 7;
    auVar26[0x1d] = 7;
    auVar26[0x1e] = 7;
    auVar26[0x1f] = 7;
    auVar27[8] = 0x70;
    auVar27._0_8_ = 0x7070707070707070;
    auVar27[9] = 0x70;
    auVar27[10] = 0x70;
    auVar27[0xb] = 0x70;
    auVar27[0xc] = 0x70;
    auVar27[0xd] = 0x70;
    auVar27[0xe] = 0x70;
    auVar27[0xf] = 0x70;
    auVar27[0x10] = 0x70;
    auVar27[0x11] = 0x70;
    auVar27[0x12] = 0x70;
    auVar27[0x13] = 0x70;
    auVar27[0x14] = 0x70;
    auVar27[0x15] = 0x70;
    auVar27[0x16] = 0x70;
    auVar27[0x17] = 0x70;
    auVar27[0x18] = 0x70;
    auVar27[0x19] = 0x70;
    auVar27[0x1a] = 0x70;
    auVar27[0x1b] = 0x70;
    auVar27[0x1c] = 0x70;
    auVar27[0x1d] = 0x70;
    auVar27[0x1e] = 0x70;
    auVar27[0x1f] = 0x70;
    pauVar3 = (undefined1 (*) [32])(data + (len & 0xffffffffffffff80));
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar28 = *(undefined1 (*) [32])data;
      pauVar1 = (undefined1 (*) [32])((long)data + 0x20);
      pauVar2 = (undefined1 (*) [32])((long)data + 0x40);
      auVar7 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)data + 0x60));
      data = (uint8_t *)((long)data + 0x80);
      auVar8 = vpandd_avx512vl(auVar28,auVar22);
      auVar9 = vpandd_avx512vl(*pauVar1,auVar22);
      auVar28 = vpsrld_avx2(auVar28,1);
      auVar29 = vpsrld_avx2(*pauVar1,1);
      auVar28 = vpand_avx2(auVar28,auVar22);
      auVar29 = vpand_avx2(auVar29,auVar22);
      auVar8 = vpaddd_avx512vl(auVar9,auVar8);
      auVar9 = vpandd_avx512vl(auVar7,auVar22);
      auVar7 = vpsrld_avx512vl(auVar7,1);
      auVar28 = vpaddd_avx2(auVar29,auVar28);
      auVar29 = vpand_avx2(*pauVar2,auVar22);
      auVar31 = vpsrld_avx2(*pauVar2,1);
      auVar7 = vpandd_avx512vl(auVar7,auVar22);
      auVar9 = vpaddd_avx512vl(auVar9,auVar29);
      auVar29 = vpand_avx2(auVar31,auVar22);
      auVar29 = vpaddd_avx512vl(auVar7,auVar29);
      auVar7 = vpandd_avx512vl(auVar8,auVar24);
      auVar31 = vpandd_avx512vl(auVar9,auVar24);
      auVar8 = vpsrld_avx512vl(auVar8,2);
      auVar30 = vpsrld_avx2(auVar9,2);
      auVar9 = vpaddd_avx512vl(auVar31,auVar7);
      auVar31 = vpandd_avx512vl(auVar28,auVar24);
      auVar10 = vpandd_avx512vl(auVar29,auVar24);
      auVar7 = vpsrld_avx2(auVar28,2);
      auVar32 = vpsrld_avx2(auVar29,2);
      auVar8 = vpandd_avx512vl(auVar8,auVar24);
      auVar28 = vpand_avx2(auVar30,auVar24);
      auVar29 = vpand_avx2(auVar7,auVar24);
      auVar7 = vpand_avx2(auVar32,auVar24);
      auVar10 = vpaddd_avx512vl(auVar10,auVar31);
      auVar30 = vpaddd_avx512vl(auVar28,auVar8);
      auVar31 = vpaddd_avx2(auVar7,auVar29);
      auVar28 = vpandq_avx512vl(auVar9,auVar26);
      auVar21 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar28 = vpsadbw_avx2(auVar28,auVar21);
      auVar28 = vpaddq_avx2(auVar28,auVar20._0_32_);
      auVar20 = ZEXT3264(auVar28);
      auVar29 = vpandq_avx512vl(auVar9,auVar27);
      auVar29 = vpsadbw_avx2(auVar29,auVar21);
      auVar29 = vpaddq_avx2(auVar29,auVar16._0_32_);
      auVar16 = ZEXT3264(auVar29);
      auVar7 = vpandq_avx512vl(auVar10,auVar26);
      auVar7 = vpsadbw_avx2(auVar7,auVar21);
      auVar7 = vpaddq_avx2(auVar7,auVar19._0_32_);
      auVar19 = ZEXT3264(auVar7);
      auVar8 = vpandq_avx512vl(auVar10,auVar27);
      auVar8 = vpsadbw_avx2(auVar8,auVar21);
      auVar8 = vpaddq_avx2(auVar8,auVar15._0_32_);
      auVar15 = ZEXT3264(auVar8);
      auVar9 = vpand_avx2(auVar30,auVar26);
      auVar10 = vpand_avx2(auVar30,auVar27);
      auVar10 = vpsadbw_avx2(auVar10,auVar21);
      auVar32 = vpsadbw_avx2(auVar9,auVar21);
      auVar9 = vpaddq_avx2(auVar10,auVar14._0_32_);
      auVar14 = ZEXT3264(auVar9);
      auVar10 = vpand_avx2(auVar31,auVar26);
      auVar30 = vpand_avx2(auVar31,auVar27);
      auVar31 = vpaddq_avx2(auVar32,auVar18._0_32_);
      auVar18 = ZEXT3264(auVar31);
      auVar10 = vpsadbw_avx2(auVar10,auVar21);
      auVar30 = vpsadbw_avx2(auVar30,auVar21);
      auVar10 = vpaddq_avx2(auVar10,auVar17._0_32_);
      auVar17 = ZEXT3264(auVar10);
      auVar30 = vpaddq_avx2(auVar30,auVar13._0_32_);
      auVar13 = ZEXT3264(auVar30);
    } while ((undefined1 (*) [32])data != pauVar3);
  }
  auVar6 = vpunpcklqdq_avx(auVar28._0_16_,auVar7._0_16_);
  uVar11 = auVar10._0_8_;
  auVar23._8_8_ = uVar11;
  auVar23._0_8_ = uVar11;
  auVar23._16_8_ = uVar11;
  auVar23._24_8_ = uVar11;
  auVar24 = vpermq_avx2(auVar31,0x55);
  auVar21._0_16_ = ZEXT116(0) * auVar31._0_16_ + ZEXT116(1) * auVar6;
  auVar21._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31._0_16_;
  auVar22 = vpblendd_avx2(auVar21,auVar23,0xc0);
  auVar6 = vpunpckhqdq_avx(auVar28._0_16_,auVar7._0_16_);
  auVar24 = vpblendd_avx2(ZEXT1632(auVar6),auVar24,0xf0);
  auVar12 = auVar30._0_16_;
  auVar25._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar12;
  auVar25._16_16_ = ZEXT116(0) * auVar30._16_16_ + ZEXT116(1) * auVar10._0_16_;
  auVar26 = vpblendd_avx2(auVar24,auVar25,0xc0);
  auVar24 = vpmovsxbq_avx2(ZEXT416(0x6020100));
  auVar22 = vpaddq_avx2(auVar22,auVar26);
  auVar27 = vpunpcklqdq_avx2(auVar28,auVar7);
  auVar26 = vpunpckhqdq_avx2(auVar28,auVar7);
  auVar28 = vperm2i128_avx2(auVar27,auVar31,0x31);
  auVar28 = vpermt2q_avx512vl(auVar28,auVar24,auVar10);
  auVar28 = vpaddq_avx2(auVar22,auVar28);
  auVar7 = vpmovsxbq_avx2(ZEXT416(0x7070302));
  auVar31 = vpermt2q_avx512vl(auVar26,auVar7,auVar31);
  uVar11 = auVar30._0_8_;
  auVar32._8_8_ = uVar11;
  auVar32._0_8_ = uVar11;
  auVar32._16_8_ = uVar11;
  auVar32._24_8_ = uVar11;
  auVar31 = vpblendd_avx2(auVar31,auVar10,0xc0);
  auVar10 = vpermq_avx2(auVar9,0x55);
  auVar28 = vpaddq_avx2(auVar28,auVar31);
  auVar6 = vpmovqd_avx512vl(auVar28);
  auVar6 = vpaddd_avx(auVar6,*(undefined1 (*) [16])flag_counts);
  *(undefined1 (*) [16])flag_counts = auVar6;
  auVar6 = vpunpcklqdq_avx(auVar29._0_16_,auVar8._0_16_);
  auVar28._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar6;
  auVar28._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar9._0_16_;
  auVar28 = vpblendd_avx2(auVar28,auVar32,0xc0);
  auVar6 = vpunpckhqdq_avx(auVar29._0_16_,auVar8._0_16_);
  auVar31 = vpblendd_avx2(ZEXT1632(auVar6),auVar10,0xf0);
  auVar10._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar12;
  auVar10._16_16_ = ZEXT116(0) * auVar30._16_16_ + ZEXT116(1) * auVar12;
  auVar31 = vpblendd_avx2(auVar31,auVar10,0xc0);
  auVar28 = vpaddq_avx2(auVar28,auVar31);
  auVar31 = vpunpcklqdq_avx2(auVar29,auVar8);
  auVar29 = vpunpckhqdq_avx2(auVar29,auVar8);
  auVar8 = vperm2i128_avx2(auVar31,auVar9,0x31);
  auVar29 = vpermt2q_avx512vl(auVar29,auVar7,auVar9);
  auVar7 = vpermt2q_avx512vl(auVar8,auVar24,auVar30);
  auVar29 = vpblendd_avx2(auVar29,auVar30,0xc0);
  auVar28 = vpaddq_avx2(auVar28,auVar7);
  auVar28 = vpaddq_avx2(auVar28,auVar29);
  auVar28 = vpsrlq_avx2(auVar28,4);
  auVar6 = vpmovqd_avx512vl(auVar28);
  auVar6 = vpaddd_avx(auVar6,*(undefined1 (*) [16])(flag_counts + 4));
  *(undefined1 (*) [16])(flag_counts + 4) = auVar6;
  if ((len & 0xff) != 0) {
    uVar4 = 0;
    do {
      lVar5 = 0;
      do {
        flag_counts[lVar5] =
             flag_counts[lVar5] + (uint)(((byte)(*pauVar3)[uVar4] >> ((uint)lVar5 & 0x1f) & 1) != 0)
        ;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != (len & 0xff));
  }
  return;
}

Assistant:

void pospopcnt_u8_avx2_horizreduce(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m256i zero = _mm256_setzero_si256();

    __m256i counter_a = zero;
    __m256i counter_b = zero;
    __m256i counter_c = zero;
    __m256i counter_d = zero;
    __m256i counter_e = zero;
    __m256i counter_f = zero;
    __m256i counter_g = zero;
    __m256i counter_h = zero;

    for (const uint8_t* end = &data[(len & ~127)]; data != end; data += 128) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m256i r0 = _mm256_loadu_si256((__m256i*)&data[0*32]);
        const __m256i r1 = _mm256_loadu_si256((__m256i*)&data[1*32]);
        const __m256i r2 = _mm256_loadu_si256((__m256i*)&data[2*32]);
        const __m256i r3 = _mm256_loadu_si256((__m256i*)&data[3*32]);

        // s0 = [a0+a1|c0+c1|e0+e1|g0+g1]
        // s1 = [b0+b1|d0+d1|f0+f1|h0+h1]
        // s2 = [a2+a3|c2+c3|e2+e3|g2+g3]
        // s3 = [b2+b3|d2+d3|f2+f3|h2+h3]
        const __m256i s0 = avx2_add1_even(r0, r1);
        const __m256i s1 = avx2_add1_odd (r0, r1);
        const __m256i s2 = avx2_add1_even(r2, r3);
        const __m256i s3 = avx2_add1_odd (r2, r3);

        // d0 = [a0+a1+a2+a3|e0+e1+e2+e3]
        // d1 = [b0+b1+b2+b3|f0+f1+f2+f3]
        // d2 = [c0+c1+c2+c3|g0+g1+g2+g3]
        // d3 = [d0+d1+d2+d3|h0+h1+h2+h3]
        const __m256i d0 = avx2_add2_even(s0, s2);
        const __m256i d1 = avx2_add2_even(s1, s3);
        const __m256i d2 = avx2_add2_odd (s0, s2);
        const __m256i d3 = avx2_add2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m256i mask_lo = _mm256_set1_epi8(0x0f);
        const __m256i mask_hi = _mm256_set1_epi8(0xf0);
        // Note: counter for higher nibble have to be divided by 16
        const __m256i sum0 = _mm256_sad_epu8(d0 & mask_lo, zero);
        const __m256i sum1 = _mm256_sad_epu8(d0 & mask_hi, zero);
        const __m256i sum2 = _mm256_sad_epu8(d1 & mask_lo, zero);
        const __m256i sum3 = _mm256_sad_epu8(d1 & mask_hi, zero);
        const __m256i sum4 = _mm256_sad_epu8(d2 & mask_lo, zero);
        const __m256i sum5 = _mm256_sad_epu8(d2 & mask_hi, zero);
        const __m256i sum6 = _mm256_sad_epu8(d3 & mask_lo, zero);
        const __m256i sum7 = _mm256_sad_epu8(d3 & mask_hi, zero);

        counter_a = _mm256_add_epi64(counter_a, sum0);
        counter_b = _mm256_add_epi64(counter_b, sum1);
        counter_c = _mm256_add_epi64(counter_c, sum2);
        counter_d = _mm256_add_epi64(counter_d, sum3);
        counter_e = _mm256_add_epi64(counter_e, sum4);
        counter_f = _mm256_add_epi64(counter_f, sum5);
        counter_g = _mm256_add_epi64(counter_g, sum6);
        counter_h = _mm256_add_epi64(counter_h, sum7);
    }

    flag_counts[0] += avx2_sum_epu64(counter_a);
    flag_counts[1] += avx2_sum_epu64(counter_c);
    flag_counts[2] += avx2_sum_epu64(counter_e);
    flag_counts[3] += avx2_sum_epu64(counter_g);
    flag_counts[4] += avx2_sum_epu64(counter_b) >> 4;
    flag_counts[5] += avx2_sum_epu64(counter_d) >> 4;
    flag_counts[6] += avx2_sum_epu64(counter_f) >> 4;
    flag_counts[7] += avx2_sum_epu64(counter_h) >> 4;

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % 256, flag_counts);
}